

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkCollectObjects(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *Entry;
  int local_24;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vNodes;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(100);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_24 < iVar1; local_24 = local_24 + 1) {
    Entry = Abc_NtkObj(pNtk,local_24);
    if (Entry != (Abc_Obj_t *)0x0) {
      Vec_PtrPush(p,Entry);
    }
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectObjects( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vNodes;
    Abc_Obj_t * pNode;
    int i;
    vNodes = Vec_PtrAlloc( 100 );
    Abc_NtkForEachObj( pNtk, pNode, i )
        Vec_PtrPush( vNodes, pNode );
    return vNodes;
}